

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

void __thiscall QDebugStateSaver::QDebugStateSaver(QDebugStateSaver *this,QDebug *dbg)

{
  Stream *pSVar1;
  QTextStreamPrivate *pQVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  _Head_base<0UL,_QDebugStateSaverPrivate_*,_false> _Var7;
  
  _Var7._M_head_impl = (QDebugStateSaverPrivate *)operator_new(0x30);
  pSVar1 = dbg->stream;
  (_Var7._M_head_impl)->m_stream = pSVar1;
  (_Var7._M_head_impl)->m_spaces = pSVar1->space;
  (_Var7._M_head_impl)->m_noQuotes = pSVar1->noQuotes;
  (_Var7._M_head_impl)->m_verbosity = pSVar1->verbosity;
  pQVar2 = (pSVar1->ts).d_ptr._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  iVar6 = (pQVar2->params).integerBase;
  lVar3 = *(long *)&(pQVar2->params).fieldWidth;
  uVar4 = *(undefined8 *)&(pQVar2->params).padChar;
  uVar5 = *(undefined8 *)&(pQVar2->params).realNumberNotation;
  ((_Var7._M_head_impl)->m_streamParams).realNumberPrecision = (pQVar2->params).realNumberPrecision;
  ((_Var7._M_head_impl)->m_streamParams).integerBase = iVar6;
  *(long *)((long)&(_Var7._M_head_impl)->m_streamParams + 8) = lVar3;
  *(undefined8 *)((long)&(_Var7._M_head_impl)->m_streamParams + 0xc) = uVar4;
  *(undefined8 *)((long)&(_Var7._M_head_impl)->m_streamParams + 0x14) = uVar5;
  (this->d)._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl = _Var7._M_head_impl;
  return;
}

Assistant:

QDebugStateSaver::QDebugStateSaver(QDebug &dbg)
    : d(new QDebugStateSaverPrivate(dbg.stream))
{
}